

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mining.cpp
# Opt level: O0

RPCHelpMan * generatetoaddress(void)

{
  initializer_list<RPCArg> __l;
  initializer_list<RPCResult> __l_00;
  RPCHelpMan *in_RDI;
  undefined1 *puVar1;
  long in_FS_OFFSET;
  allocator<RPCResult> *in_stack_fffffffffffff448;
  RPCArg *this;
  UniValue *in_stack_fffffffffffff450;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff458;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff460;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff478;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff480;
  UniValue *in_stack_fffffffffffff488;
  iterator in_stack_fffffffffffff490;
  RPCArgOptions *in_stack_fffffffffffff498;
  string *in_stack_fffffffffffff4a0;
  undefined7 in_stack_fffffffffffff4a8;
  undefined1 in_stack_fffffffffffff4af;
  vector<RPCResult,_std::allocator<RPCResult>_> *in_stack_fffffffffffff4b0;
  string *in_stack_fffffffffffff4b8;
  undefined1 *puVar2;
  RPCArg *in_stack_fffffffffffff4c0;
  RPCResults *in_stack_fffffffffffff4c8;
  RPCResult *in_stack_fffffffffffff4d0;
  string *psVar3;
  string *local_b28;
  RPCResults *results;
  undefined7 in_stack_fffffffffffff5a0;
  undefined1 uVar4;
  string *name;
  RPCHelpMan *this_00;
  allocator<char> local_9dd;
  allocator<char> local_9dc;
  allocator<char> local_9db;
  allocator<char> local_9da [2];
  pointer local_9d8;
  pointer pRStack_9d0;
  pointer local_9c8;
  allocator<char> local_9b2;
  allocator<char> local_9b1 [31];
  allocator<char> local_992;
  allocator<char> local_991 [30];
  allocator<char> local_973;
  allocator<char> local_972;
  allocator<char> local_971 [7];
  allocator<char> local_96a;
  allocator<char> local_969;
  undefined4 local_968;
  allocator<char> local_961 [17];
  undefined8 in_stack_fffffffffffff6b0;
  allocator<char> local_942;
  RPCResults local_941 [16];
  string local_7c0 [4];
  string local_738 [6];
  undefined1 local_670;
  undefined8 local_648;
  undefined8 uStack_640;
  undefined8 local_638;
  undefined1 local_630;
  undefined1 local_62f;
  undefined1 local_530;
  undefined8 local_508;
  undefined8 uStack_500;
  undefined8 local_4f8;
  undefined1 local_4f0;
  undefined1 local_4ef;
  undefined1 local_448;
  undefined8 local_420;
  undefined8 uStack_418;
  undefined8 local_410;
  undefined1 local_408;
  undefined1 local_407;
  undefined1 local_360 [792];
  undefined1 local_48 [64];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  results = local_941;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff498,(char *)in_stack_fffffffffffff490,
             (allocator<char> *)in_stack_fffffffffffff488);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff498,(char *)in_stack_fffffffffffff490,
             (allocator<char> *)in_stack_fffffffffffff488);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff498,(char *)in_stack_fffffffffffff490,
             (allocator<char> *)in_stack_fffffffffffff488);
  local_968._0_1_ = '\0';
  local_968._1_3_ = 0;
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<RPCArg::Optional,void,void,RPCArg::Optional,void>
            ((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)in_stack_fffffffffffff458,&in_stack_fffffffffffff450->typ);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff498,(char *)in_stack_fffffffffffff490,
             (allocator<char> *)in_stack_fffffffffffff488);
  local_448 = 0;
  std::__cxx11::string::string(in_stack_fffffffffffff460);
  local_420 = 0;
  uStack_418 = 0;
  local_410 = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_stack_fffffffffffff448);
  local_408 = 0;
  local_407 = 0;
  RPCArg::RPCArg(in_stack_fffffffffffff4c0,in_stack_fffffffffffff4b8,
                 (Type)((ulong)in_stack_fffffffffffff4b0 >> 0x20),
                 (Fallback *)CONCAT17(in_stack_fffffffffffff4af,in_stack_fffffffffffff4a8),
                 in_stack_fffffffffffff4a0,in_stack_fffffffffffff498);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff498,(char *)in_stack_fffffffffffff490,
             (allocator<char> *)in_stack_fffffffffffff488);
  local_971[1] = (allocator<char>)0x0;
  local_971[2] = (allocator<char>)0x0;
  local_971[3] = (allocator<char>)0x0;
  local_971[4] = (allocator<char>)0x0;
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<RPCArg::Optional,void,void,RPCArg::Optional,void>
            ((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)in_stack_fffffffffffff458,&in_stack_fffffffffffff450->typ);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff498,(char *)in_stack_fffffffffffff490,
             (allocator<char> *)in_stack_fffffffffffff488);
  local_530 = 0;
  std::__cxx11::string::string(in_stack_fffffffffffff460);
  local_508 = 0;
  uStack_500 = 0;
  local_4f8 = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_stack_fffffffffffff448);
  local_4f0 = 0;
  local_4ef = 0;
  RPCArg::RPCArg(in_stack_fffffffffffff4c0,in_stack_fffffffffffff4b8,
                 (Type)((ulong)in_stack_fffffffffffff4b0 >> 0x20),
                 (Fallback *)CONCAT17(in_stack_fffffffffffff4af,in_stack_fffffffffffff4a8),
                 in_stack_fffffffffffff4a0,in_stack_fffffffffffff498);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff498,(char *)in_stack_fffffffffffff490,
             (allocator<char> *)in_stack_fffffffffffff488);
  UniValue::UniValue<const_unsigned_long_&,_unsigned_long,_true>
            (in_stack_fffffffffffff488,(unsigned_long *)in_stack_fffffffffffff480);
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<UniValue,void,void,UniValue,void>
            ((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)in_stack_fffffffffffff458,in_stack_fffffffffffff450);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff498,(char *)in_stack_fffffffffffff490,
             (allocator<char> *)in_stack_fffffffffffff488);
  local_670 = 0;
  std::__cxx11::string::string(in_stack_fffffffffffff460);
  local_648 = 0;
  uStack_640 = 0;
  local_638 = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_stack_fffffffffffff448);
  local_630 = 0;
  local_62f = 0;
  RPCArg::RPCArg(in_stack_fffffffffffff4c0,in_stack_fffffffffffff4b8,
                 (Type)((ulong)in_stack_fffffffffffff4b0 >> 0x20),
                 (Fallback *)CONCAT17(in_stack_fffffffffffff4af,in_stack_fffffffffffff4a8),
                 in_stack_fffffffffffff4a0,in_stack_fffffffffffff498);
  std::allocator<RPCArg>::allocator((allocator<RPCArg> *)in_stack_fffffffffffff448);
  __l._M_len = (size_type)in_stack_fffffffffffff498;
  __l._M_array = in_stack_fffffffffffff490;
  std::vector<RPCArg,_std::allocator<RPCArg>_>::vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)in_stack_fffffffffffff488,__l,
             (allocator_type *)in_stack_fffffffffffff480);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff498,(char *)in_stack_fffffffffffff490,
             (allocator<char> *)in_stack_fffffffffffff488);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff498,(char *)in_stack_fffffffffffff490,
             (allocator<char> *)in_stack_fffffffffffff488);
  psVar3 = local_7c0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff498,(char *)in_stack_fffffffffffff490,
             (allocator<char> *)in_stack_fffffffffffff488);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff498,(char *)in_stack_fffffffffffff490,
             (allocator<char> *)in_stack_fffffffffffff488);
  local_9d8 = (pointer)0x0;
  pRStack_9d0 = (pointer)0x0;
  local_9c8 = (pointer)0x0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_fffffffffffff448);
  RPCResult::RPCResult
            (in_stack_fffffffffffff4d0,(Type)((ulong)in_stack_fffffffffffff4c8 >> 0x20),
             &in_stack_fffffffffffff4c0->m_names,in_stack_fffffffffffff4b8,in_stack_fffffffffffff4b0
             ,(bool)in_stack_fffffffffffff4af);
  uVar4 = 0;
  name = local_7c0;
  this_00 = (RPCHelpMan *)0x1;
  std::allocator<RPCResult>::allocator(in_stack_fffffffffffff448);
  __l_00._M_len = (size_type)in_stack_fffffffffffff498;
  __l_00._M_array = (iterator)in_stack_fffffffffffff490;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_fffffffffffff488,__l_00,
             (allocator_type *)in_stack_fffffffffffff480);
  RPCResult::RPCResult
            (in_stack_fffffffffffff4d0,(Type)((ulong)in_stack_fffffffffffff4c8 >> 0x20),
             &in_stack_fffffffffffff4c0->m_names,in_stack_fffffffffffff4b8,in_stack_fffffffffffff4b0
             ,(bool)in_stack_fffffffffffff4af);
  RPCResults::RPCResults(in_stack_fffffffffffff4c8,(RPCResult *)in_stack_fffffffffffff4c0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff498,(char *)in_stack_fffffffffffff490,
             (allocator<char> *)in_stack_fffffffffffff488);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff498,(char *)in_stack_fffffffffffff490,
             (allocator<char> *)in_stack_fffffffffffff488);
  HelpExampleCli(in_stack_fffffffffffff480,in_stack_fffffffffffff478);
  std::operator+((char *)in_stack_fffffffffffff460,in_stack_fffffffffffff458);
  std::operator+(in_stack_fffffffffffff460,(char *)in_stack_fffffffffffff458);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff498,(char *)in_stack_fffffffffffff490,
             (allocator<char> *)in_stack_fffffffffffff488);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff498,(char *)in_stack_fffffffffffff490,
             (allocator<char> *)in_stack_fffffffffffff488);
  HelpExampleCli(in_stack_fffffffffffff480,in_stack_fffffffffffff478);
  std::operator+(in_stack_fffffffffffff480,in_stack_fffffffffffff478);
  RPCExamples::RPCExamples((RPCExamples *)in_stack_fffffffffffff448,(string *)0x13280e8);
  this = (RPCArg *)&stack0xfffffffffffff600;
  std::function<UniValue(RPCHelpMan_const&,JSONRPCRequest_const&)>::
  function<generatetoaddress()::__0,void>
            ((function<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&)> *)
             in_stack_fffffffffffff458,(anon_class_1_0_00000001 *)in_stack_fffffffffffff450);
  RPCHelpMan::RPCHelpMan
            (this_00,name,psVar3,
             (vector<RPCArg,_std::allocator<RPCArg>_> *)CONCAT17(uVar4,in_stack_fffffffffffff5a0),
             results,(RPCExamples *)in_RDI,(RPCMethodImpl *)in_stack_fffffffffffff6b0);
  std::function<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&)>::~function
            ((function<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&)> *)this);
  RPCExamples::~RPCExamples((RPCExamples *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_9dd);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_9dc);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_9db);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(local_9da);
  RPCResults::~RPCResults((RPCResults *)this);
  RPCResult::~RPCResult((RPCResult *)this);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_fffffffffffff458);
  std::allocator<RPCResult>::~allocator((allocator<RPCResult> *)this);
  psVar3 = local_7c0;
  local_b28 = local_738;
  do {
    local_b28 = (string *)((long)&local_b28[-5].field_2 + 8);
    RPCResult::~RPCResult((RPCResult *)this);
  } while (local_b28 != psVar3);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_fffffffffffff458);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_9b2);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(local_9b1);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_992);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(local_991);
  std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)in_stack_fffffffffffff458);
  std::allocator<RPCArg>::~allocator((allocator<RPCArg> *)this);
  puVar2 = local_360;
  puVar1 = local_48;
  do {
    puVar1 = puVar1 + -0x108;
    RPCArg::~RPCArg(this);
  } while (puVar1 != puVar2);
  RPCArgOptions::~RPCArgOptions((RPCArgOptions *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_973);
  std::
  variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~variant((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)this);
  UniValue::~UniValue((UniValue *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_972);
  RPCArgOptions::~RPCArgOptions((RPCArgOptions *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(local_971);
  std::
  variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~variant((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_96a);
  RPCArgOptions::~RPCArgOptions((RPCArgOptions *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_969);
  std::
  variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~variant((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(local_961);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_942);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator((allocator<char> *)local_941);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

static RPCHelpMan generatetoaddress()
{
    return RPCHelpMan{"generatetoaddress",
        "Mine to a specified address and return the block hashes.",
         {
             {"nblocks", RPCArg::Type::NUM, RPCArg::Optional::NO, "How many blocks are generated."},
             {"address", RPCArg::Type::STR, RPCArg::Optional::NO, "The address to send the newly generated bitcoin to."},
             {"maxtries", RPCArg::Type::NUM, RPCArg::Default{DEFAULT_MAX_TRIES}, "How many iterations to try."},
         },
         RPCResult{
             RPCResult::Type::ARR, "", "hashes of blocks generated",
             {
                 {RPCResult::Type::STR_HEX, "", "blockhash"},
             }},
         RPCExamples{
            "\nGenerate 11 blocks to myaddress\n"
            + HelpExampleCli("generatetoaddress", "11 \"myaddress\"")
            + "If you are using the " PACKAGE_NAME " wallet, you can get a new address to send the newly generated bitcoin to with:\n"
            + HelpExampleCli("getnewaddress", "")
                },
        [&](const RPCHelpMan& self, const JSONRPCRequest& request) -> UniValue
{
    const int num_blocks{request.params[0].getInt<int>()};
    const uint64_t max_tries{request.params[2].isNull() ? DEFAULT_MAX_TRIES : request.params[2].getInt<int>()};

    CTxDestination destination = DecodeDestination(request.params[1].get_str());
    if (!IsValidDestination(destination)) {
        throw JSONRPCError(RPC_INVALID_ADDRESS_OR_KEY, "Error: Invalid address");
    }

    NodeContext& node = EnsureAnyNodeContext(request.context);
    Mining& miner = EnsureMining(node);
    ChainstateManager& chainman = EnsureChainman(node);

    CScript coinbase_script = GetScriptForDestination(destination);

    return generateBlocks(chainman, miner, coinbase_script, num_blocks, max_tries);
},
    };
}